

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_pbkdf.c
# Opt level: O0

err_t beltPBKDF2(octet *key,octet *pwd,size_t pwd_len,size_t iter,octet *salt,size_t salt_len)

{
  bool_t bVar1;
  octet *mac;
  size_t sVar2;
  octet *src;
  long in_RCX;
  size_t in_RDX;
  void *in_RSI;
  undefined4 *in_RDI;
  void *in_R8;
  octet *in_R9;
  octet *t;
  void *state;
  void *in_stack_ffffffffffffffa8;
  octet *buf;
  long local_28;
  
  if ((((in_RCX != 0) && (bVar1 = memIsValid(in_RSI,in_RDX), bVar1 != 0)) &&
      (bVar1 = memIsValid(in_R8,(size_t)in_R9), bVar1 != 0)) &&
     (bVar1 = memIsValid(in_RDI,0x20), bVar1 != 0)) {
    beltHMAC_keep();
    mac = (octet *)blobCreate((size_t)in_stack_ffffffffffffffa8);
    if (mac == (octet *)0x0) {
      return 0x6e;
    }
    buf = mac;
    sVar2 = beltHMAC_keep();
    src = mac + sVar2;
    beltHMACStart(in_R8,in_R9,(size_t)buf);
    beltHMACStepA(buf,(size_t)src,mac);
    *in_RDI = 0;
    *(undefined1 *)((long)in_RDI + 3) = 1;
    beltHMACStepA(buf,(size_t)src,mac);
    beltHMACStepG(mac,in_stack_ffffffffffffffa8);
    memCopy(mac,in_stack_ffffffffffffffa8,0x15d154);
    local_28 = in_RCX;
    while (local_28 = local_28 + -1, local_28 != 0) {
      beltHMACStart(in_R8,in_R9,(size_t)buf);
      beltHMACStepA(buf,(size_t)src,mac);
      beltHMACStepG(mac,in_stack_ffffffffffffffa8);
      memXor2(in_RDI,src,0x20);
    }
    blobClose((blob_t)0x15d1bf);
    return 0;
  }
  return 0x6d;
}

Assistant:

err_t beltPBKDF2(octet key[32], const octet pwd[], size_t pwd_len,
	size_t iter, const octet salt[], size_t salt_len)
{
	void* state;
	octet* t;
	// проверить входные данные
	if (iter == 0 ||
		!memIsValid(pwd, pwd_len) ||
		!memIsValid(salt, salt_len) ||
		!memIsValid(key, 32))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltHMAC_keep() + 32);
	if (state == 0)
		return ERR_OUTOFMEMORY;
	t = (octet*)state + beltHMAC_keep();
	// key <- HMAC(pwd, salt || 00000001)
	beltHMACStart(state, pwd, pwd_len);
	beltHMACStepA(salt, salt_len, state);
	*(u32*)key = 0, key[3] = 1;
	beltHMACStepA(key, 4, state);
	beltHMACStepG(key, state);
	// пересчитать key
	memCopy(t, key, 32);
	while (--iter)
	{
		beltHMACStart(state, pwd, pwd_len);
		beltHMACStepA(t, 32, state);
		beltHMACStepG(t, state);
		memXor2(key, t, 32);
	}
	// завершить
	blobClose(state);
	return ERR_OK;
}